

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_context.cpp
# Opt level: O1

vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
* __thiscall
jessilib::io::command_context::paramaters
          (vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
           *__return_storage_ptr__,command_context *this)

{
  pointer *ppbVar1;
  pointer pcVar2;
  size_type sVar3;
  iterator __position;
  size_type sVar4;
  void *pvVar5;
  ulong uVar6;
  size_type sVar7;
  ulong uVar8;
  ulong uVar9;
  char8_t *__s;
  size_type __n;
  ulong uVar10;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (this->m_parameter)._M_dataplus._M_p;
  sVar3 = (this->m_parameter)._M_string_length;
  sVar4 = 0xffffffffffffffff;
  if (sVar3 != 0) {
    sVar7 = 0;
    do {
      sVar4 = sVar7;
      if (pcVar2[sVar7] != ' ') break;
      sVar7 = sVar7 + 1;
      sVar4 = 0xffffffffffffffff;
    } while (sVar3 != sVar7);
  }
  if ((sVar4 != 0xffffffffffffffff) && (uVar10 = sVar3 - sVar4, uVar10 != 0)) {
    __s = pcVar2 + sVar4;
    do {
      pvVar5 = memchr(__s,0x20,uVar10);
      uVar9 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)__s;
      if (uVar9 == 0xffffffffffffffff) {
        uVar9 = uVar10;
      }
      local_38._M_len = uVar9;
      if (uVar10 < uVar9) {
        local_38._M_len = uVar10;
      }
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_38._M_str = __s;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::allocator<std::basic_string_view<char8_t,std::char_traits<char8_t>>>>
        ::_M_realloc_insert<std::basic_string_view<char8_t,std::char_traits<char8_t>>>
                  ((vector<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::allocator<std::basic_string_view<char8_t,std::char_traits<char8_t>>>>
                    *)__return_storage_ptr__,__position,&local_38);
      }
      else {
        (__position._M_current)->_M_len = local_38._M_len;
        (__position._M_current)->_M_str = __s;
        ppbVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      uVar10 = uVar10 - uVar9;
      uVar6 = 0xffffffffffffffff;
      if (uVar10 != 0) {
        uVar8 = 0;
        do {
          uVar6 = uVar8;
          if (__s[uVar8 + uVar9] != ' ') break;
          uVar8 = uVar8 + 1;
          uVar6 = 0xffffffffffffffff;
        } while (uVar10 != uVar8);
      }
      if (uVar10 < uVar6) {
        uVar6 = uVar10;
      }
      __s = __s + uVar6 + uVar9;
      uVar10 = uVar10 - uVar6;
    } while (uVar10 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::u8string_view> command_context::paramaters() const {
	std::vector<std::u8string_view> result;
	std::u8string_view parameter = m_parameter;

	// Strip leading whitespace
	std::size_t pos = parameter.find_first_not_of(' ');
	if (pos == std::string_view::npos) {
		// parameter is empty; return empty vector
		return result;
	}
	parameter.remove_prefix(pos);

	// Parse parameter into result
	while (!parameter.empty()) {
		// Parse word from parameter into result
		pos = parameter.find(' ');
		if (pos == std::string_view::npos) {
			pos = parameter.size();
		}
		result.push_back(parameter.substr(0, pos));

		// Strip word and trailing whitespace
		parameter.remove_prefix(pos);
		parameter.remove_prefix(std::min(parameter.find_first_not_of(' '), parameter.size()));
	}

	return result;
}